

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forrest_tomlin.cc
# Opt level: O1

void __thiscall ipx::ForrestTomlin::_BtranForUpdate(ForrestTomlin *this,Int j,IndexedVector *lhs)

{
  ulong uVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer piVar6;
  double *pdVar7;
  pointer piVar8;
  pointer piVar9;
  pointer pdVar10;
  double *pdVar11;
  bool bVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  
  ComputeEta(this,j);
  piVar6 = (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar13 = (uint)((ulong)((long)(this->replaced_).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)piVar6) >> 2);
  if (0 < (int)uVar13) {
    iVar3 = this->dim_;
    pdVar7 = (this->work_)._M_data;
    piVar8 = (this->R_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (this->R_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (this->R_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar14 = (ulong)(uVar13 & 0x7fffffff);
    do {
      iVar4 = piVar8[uVar14 - 1];
      lVar15 = (long)iVar4;
      iVar5 = piVar8[uVar14];
      if (iVar4 < iVar5) {
        dVar2 = pdVar7[(long)iVar3 + (uVar14 - 1)];
        do {
          iVar4 = piVar9[lVar15];
          pdVar7[iVar4] = pdVar10[lVar15] * -dVar2 + pdVar7[iVar4];
          lVar15 = lVar15 + 1;
        } while (iVar5 != lVar15);
      }
      uVar1 = uVar14 - 1;
      pdVar7[piVar6[uVar1]] = pdVar7[(long)iVar3 + uVar1];
      pdVar7[(long)iVar3 + uVar1] = 0.0;
      bVar12 = 1 < (long)uVar14;
      uVar14 = uVar1;
    } while (bVar12);
  }
  TriangularSolve(&this->L_,&this->work_,'t',"lower",1);
  iVar3 = this->dim_;
  if (0 < (long)iVar3) {
    pdVar7 = (this->work_)._M_data;
    piVar6 = (this->rowperm_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar11 = (lhs->elements_)._M_data;
    lVar15 = 0;
    do {
      pdVar11[piVar6[lVar15]] = pdVar7[lVar15];
      lVar15 = lVar15 + 1;
    } while (iVar3 != lVar15);
  }
  lhs->nnz_ = -1;
  return;
}

Assistant:

void ForrestTomlin::_BtranForUpdate(Int j, IndexedVector& lhs) {
    ComputeEta(j);

    // Apply update etas and solve with L'.
    Int num_updates = replaced_.size();
    for (Int k = num_updates-1; k >= 0; k--) {
        ScatterColumn(R_, k, -work_[dim_+k], work_);
        work_[replaced_[k]] = work_[dim_+k];
        work_[dim_+k] = 0.0;
    }
    TriangularSolve(L_, work_, 't', "lower", 1);

    // Return lhs without pattern.
    for (Int p = 0; p < dim_; p++)
        lhs[rowperm_[p]] = work_[p];
    lhs.InvalidatePattern();
}